

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring64.c
# Opt level: O0

void roaring64_bitmap_free(roaring64_bitmap_t *r)

{
  leaf_t *leaf;
  art_iterator_t it;
  container_t *in_stack_ffffffffffffff70;
  undefined7 local_88;
  uint8_t in_stack_ffffffffffffff7f;
  art_t *in_stack_ffffffffffffff80;
  
  art_init_iterator(in_stack_ffffffffffffff80,(_Bool)in_stack_ffffffffffffff7f);
  while (CONCAT17(in_stack_ffffffffffffff7f,local_88) != 0) {
    container_free(in_stack_ffffffffffffff70,in_stack_ffffffffffffff7f);
    free_leaf((leaf_t *)0x10bdb5);
    art_iterator_next((art_iterator_t *)0x10bdbf);
  }
  art_free((art_t *)0x10bdce);
  roaring_free((void *)0x10bddb);
  return;
}

Assistant:

void roaring64_bitmap_free(roaring64_bitmap_t *r) {
    art_iterator_t it = art_init_iterator(&r->art, /*first=*/true);
    while (it.value != NULL) {
        leaf_t *leaf = (leaf_t *)it.value;
        container_free(leaf->container, leaf->typecode);
        free_leaf(leaf);
        art_iterator_next(&it);
    }
    art_free(&r->art);
    roaring_free(r);
}